

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

void rgb_555_to_rgb_565(void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
                       int width,int height)

{
  short *psVar1;
  ushort *puVar2;
  short *psVar3;
  int iVar4;
  long lVar5;
  
  lVar5 = (long)width;
  puVar2 = (ushort *)((long)src + (long)sx * 2 + (long)(sy * src_pitch));
  psVar3 = (short *)((long)dst + (long)dx * 2 + (long)(dy * dst_pitch));
  iVar4 = 0;
  if (height < 1) {
    height = 0;
  }
  for (; iVar4 != height; iVar4 = iVar4 + 1) {
    psVar1 = psVar3 + lVar5;
    for (; psVar3 < psVar1; psVar3 = psVar3 + 1) {
      *psVar3 = (*puVar2 & 0x1f) + (*puVar2 & 0xffe0) * 2;
      puVar2 = puVar2 + 1;
    }
    puVar2 = puVar2 + (src_pitch / 2 - lVar5);
    psVar3 = psVar3 + (dst_pitch / 2 - lVar5);
  }
  return;
}

Assistant:

static void rgb_555_to_rgb_565(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint16_t *src_ptr = (const uint16_t *)((const char *)src + sy * src_pitch);
   uint16_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 2 - width;
   int dst_gap = dst_pitch / 2 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint16_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_RGB_555_TO_RGB_565(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}